

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::InitializeMinimumPhaseAnalysis(int fft_size,MinimumPhaseAnalysis *minimum_phase)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  int *in_RSI;
  int in_EDI;
  undefined1 local_a0 [8];
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  fft_complex *in_stack_ffffffffffffff70;
  fft_complex *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  undefined1 local_58 [72];
  int *local_10;
  int local_4;
  
  *in_RSI = in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_10 = in_RSI;
  local_4 = in_EDI;
  pvVar5 = operator_new__(uVar4);
  *(void **)(local_10 + 2) = pvVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_4;
  uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(local_10 + 4) = pvVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)local_4;
  uVar4 = SUB168(auVar3 * ZEXT816(0x10),0);
  if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(local_10 + 6) = pvVar5;
  fft_plan_dft_r2c_1d(in_stack_ffffffffffffff84,*in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                      ,in_stack_ffffffffffffff6c);
  memcpy(local_10 + 8,local_58,0x48);
  fft_plan_dft_1d(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  memcpy(local_10 + 0x1a,local_a0,0x48);
  return;
}

Assistant:

void InitializeMinimumPhaseAnalysis(int fft_size,
    MinimumPhaseAnalysis *minimum_phase) {
  minimum_phase->fft_size = fft_size;
  minimum_phase->log_spectrum = new double[fft_size];
  minimum_phase->minimum_phase_spectrum = new fft_complex[fft_size];
  minimum_phase->cepstrum = new fft_complex[fft_size];
  minimum_phase->inverse_fft = fft_plan_dft_r2c_1d(fft_size,
      minimum_phase->log_spectrum, minimum_phase->cepstrum, FFT_ESTIMATE);
  minimum_phase->forward_fft = fft_plan_dft_1d(fft_size,
      minimum_phase->cepstrum, minimum_phase->minimum_phase_spectrum,
      FFT_FORWARD, FFT_ESTIMATE);
}